

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::MenuItem(char *label,char *shortcut,bool *p_selected,bool enabled)

{
  bool bVar1;
  
  if (p_selected == (bool *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = *p_selected;
  }
  bVar1 = MenuItemEx(label,(char *)0x0,shortcut,bVar1,enabled);
  if (bVar1 && p_selected != (bool *)0x0) {
    *p_selected = (bool)(*p_selected ^ 1);
  }
  return bVar1;
}

Assistant:

bool ImGui::MenuItem(const char* label, const char* shortcut, bool* p_selected, bool enabled)
{
    if (MenuItemEx(label, NULL, shortcut, p_selected ? *p_selected : false, enabled))
    {
        if (p_selected)
            *p_selected = !*p_selected;
        return true;
    }
    return false;
}